

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_jmp_tb(DisasContext_conflict2 *s,int n,uint32_t dest)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TranslationBlock *tb;
  TCGContext_conflict2 *tcg_ctx;
  
  if ((s->base).singlestep_enabled == true) {
    gen_exception(s,dest,0x10002);
  }
  else {
    tcg_ctx_00 = s->uc->tcg_ctx;
    if ((((s->base).pc_first & 0xfffff000) == (dest & 0xfffff000)) ||
       (((s->base).pc_next & 0xfffff000) == (dest & 0xfffff000))) {
      tcg_gen_goto_tb_m68k(tcg_ctx_00,n);
      tcg_gen_op2_m68k(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(QREG_PC + (long)tcg_ctx_00),
                       (long)(int)dest);
      tb = (TranslationBlock *)(s->base).tb;
    }
    else {
      update_cc_op(s);
      tcg_gen_op2_m68k(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(QREG_PC + (long)tcg_ctx_00),
                       (long)(int)dest);
      (s->base).is_jmp = DISAS_TARGET_0;
      tb = (TranslationBlock *)0x0;
      n = 0;
    }
    tcg_gen_exit_tb_m68k(tcg_ctx_00,tb,n);
  }
  (s->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static void gen_jmp_tb(DisasContext *s, int n, uint32_t dest)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (unlikely(s->base.singlestep_enabled)) {
        gen_exception(s, dest, EXCP_DEBUG);
    } else if (use_goto_tb(s, dest)) {
        tcg_gen_goto_tb(tcg_ctx, n);
        tcg_gen_movi_i32(tcg_ctx, QREG_PC, dest);
        tcg_gen_exit_tb(tcg_ctx, s->base.tb, n);
    } else {
        gen_jmp_im(s, dest);
        tcg_gen_exit_tb(tcg_ctx, NULL, 0);
    }
    s->base.is_jmp = DISAS_NORETURN;
}